

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

bool glu::sl::isValid(ShaderCaseSpecification *spec)

{
  CaseType CVar1;
  pointer pPVar2;
  pointer pVVar3;
  pointer pEVar4;
  pointer pEVar5;
  pointer pEVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer pbVar9;
  pointer pbVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  char *pcVar21;
  char *format;
  long lVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  
  pPVar2 = (spec->programs).
           super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar2 == (spec->programs).
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar21 = "ERROR: No programs specified!\n";
    goto LAB_0056a572;
  }
  bVar25 = (pPVar2->sources).separable;
  if (spec->fullGLSLES100Required == true) {
    if (spec->targetVersion != GLSL_VERSION_100_ES) {
      pcVar21 = "ERROR: Full GLSL ES 1.00 support requested for other GLSL version!\n";
      goto LAB_0056a572;
    }
    pcVar21 = 
    "ERROR: Full GLSL ES 1.00 support doesn\'t make sense when expecting compile/link failure!\n";
    if ((EXPECT_BUILD_SUCCESSFUL < spec->expectResult) ||
       ((0x31U >> (spec->expectResult & 0x1f) & 1) == 0)) goto LAB_0056a572;
  }
  if (spec->caseType < CASETYPE_LAST) {
    if (spec->expectResult < EXPECT_LAST) {
      bVar14 = isValid(&spec->values);
      if (!bVar14) {
        return false;
      }
      pVVar3 = (spec->values).inputs.
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pVVar3 != (spec->values).inputs.
                     super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish) &&
         ((spec->values).outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (spec->values).outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        pEVar4 = (pVVar3->elements).
                 super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pEVar5 = (pVVar3->elements).
                 super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar15 = VarType::getScalarSize(&pVVar3->type);
        pVVar3 = (spec->values).outputs.
                 super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar6 = *(pointer *)
                  ((long)&(pVVar3->elements).
                          super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                  + 8);
        lVar22 = *(long *)&(pVVar3->elements).
                           super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                           ._M_impl;
        iVar16 = VarType::getScalarSize(&pVVar3->type);
        if ((ulong)((long)pEVar4 - (long)pEVar5 >> 2) / (ulong)(long)iVar15 !=
            (ulong)((long)pEVar6 - lVar22 >> 2) / (ulong)(long)iVar16) {
          pcVar21 = "ERROR: Number of input and output elements don\'t match!\n";
          goto LAB_0056a572;
        }
      }
      if (bVar25 == false) {
        pPVar2 = (spec->programs).
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)(spec->programs).
                  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 == 0xf0) {
          pbVar7 = *(pointer *)
                    &(pPVar2->sources).sources[0].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ;
          pbVar8 = *(pointer *)
                    ((long)&(pPVar2->sources).sources[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    + 8);
          pbVar9 = (pPVar2->sources).sources[1].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 = *(pointer *)((long)((pPVar2->sources).sources + 1) + 8);
          CVar1 = spec->caseType;
          if ((pbVar7 == pbVar8 || pbVar9 != pbVar10) && CVar1 == CASETYPE_VERTEX_ONLY) {
            pcVar21 = "ERROR: Vertex-only case must have only vertex shader!\n";
          }
          else if (pbVar7 == pbVar8 && pbVar9 != pbVar10 || CVar1 != CASETYPE_FRAGMENT_ONLY) {
            if (pbVar7 != pbVar8 && pbVar9 != pbVar10 || CVar1 != CASETYPE_COMPLETE) {
              return true;
            }
            pcVar21 = "ERROR: Complete case must have at least vertex and fragment shaders\n";
          }
          else {
            pcVar21 = "ERROR: Fragment-only case must have only fragment shader!\n";
          }
        }
        else {
          pcVar21 = "ERROR: Only cases using separable programs can have multiple programs!\n";
        }
      }
      else if (spec->caseType == CASETYPE_COMPLETE) {
        bVar14 = (spec->programs).
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_finish ==
                 (spec->programs).
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar25 = !bVar14;
        if (bVar14) {
          uVar18 = 0;
        }
        else {
          uVar18 = 0;
          lVar22 = 8;
          uVar20 = 0;
          do {
            uVar24 = 0;
            bVar14 = false;
            lVar23 = lVar22;
            do {
              uVar17 = 1 << ((byte)uVar24 & 0x1f);
              pPVar2 = (spec->programs).
                       super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar11 = *(long *)((long)(pPVar2->sources).sources + lVar23 + -8);
              lVar12 = *(long *)((long)&(pPVar2->sources).sources[0].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                + lVar23);
              if (uVar24 == 5) {
                if (lVar11 != lVar12) {
                  pcVar21 = getShaderTypeName(SHADERTYPE_COMPUTE);
                  format = "ERROR: Source specified for unsupported shader stage %s!\n";
                  goto LAB_0056a6b9;
                }
LAB_0056a6d6:
                bVar13 = true;
              }
              else {
                if (((pPVar2[uVar20].activeStages & uVar17) != 0) == (lVar11 == lVar12)) {
                  pcVar21 = getShaderTypeName((ShaderType)uVar24);
                  format = "ERROR: Inconsistent source/enable for shader stage %s!\n";
                }
                else {
                  if ((lVar11 == lVar12) || ((uVar18 & uVar17) == 0)) {
                    uVar19 = pPVar2[uVar20].activeStages & uVar17;
                    if (uVar19 != 0) {
                      uVar19 = uVar17;
                    }
                    uVar18 = uVar18 | uVar19;
                    goto LAB_0056a6d6;
                  }
                  pcVar21 = getShaderTypeName((ShaderType)uVar24);
                  format = "ERROR: Stage %s enabled on multiple programs!\n";
                }
LAB_0056a6b9:
                bVar13 = false;
                tcu::print(format,pcVar21);
              }
              if (!bVar13) break;
              bVar14 = 4 < uVar24;
              uVar24 = uVar24 + 1;
              lVar23 = lVar23 + 0x18;
            } while (uVar24 != 6);
            if (!bVar14) break;
            uVar20 = uVar20 + 1;
            lVar22 = lVar22 + 0xf0;
            bVar25 = uVar20 < (ulong)(((long)(spec->programs).
                                             super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(spec->programs).
                                             super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                     -0x1111111111111111);
          } while (bVar25);
        }
        if (bVar25) {
          return false;
        }
        if ((~uVar18 & 3) == 0) {
          if ((uVar18 & 0x18) == 0) {
            return true;
          }
          if ((uVar18 & 0x18) == 0x18) {
            return true;
          }
          pcVar21 = 
          "ERROR: Both tessellation control and eval shaders must be either enabled or disabled!\n";
        }
        else {
          pcVar21 = "ERROR: Vertex and fragment shaders are mandatory!\n";
        }
      }
      else {
        pcVar21 = "ERROR: Separable shaders supported only for complete cases!\n";
      }
    }
    else {
      pcVar21 = "ERROR: Invalid expected result!\n";
    }
  }
  else {
    pcVar21 = "ERROR: Invalid case type!\n";
  }
LAB_0056a572:
  tcu::print(pcVar21);
  return false;
}

Assistant:

bool isValid (const ShaderCaseSpecification& spec)
{
	const deUint32	vtxFragMask			= (1u << SHADERTYPE_VERTEX)
										| (1u << SHADERTYPE_FRAGMENT);
	const deUint32	tessCtrlEvalMask	= (1u << SHADERTYPE_TESSELLATION_CONTROL)
										| (1u << SHADERTYPE_TESSELLATION_EVALUATION);
	const deUint32	supportedStageMask	= vtxFragMask | tessCtrlEvalMask
										| (1u << SHADERTYPE_GEOMETRY);
	const bool		isSeparable			= !spec.programs.empty() && spec.programs[0].sources.separable;

	if (spec.programs.empty())
	{
		print("ERROR: No programs specified!\n");
		return false;
	}

	if (spec.fullGLSLES100Required)
	{
		if (spec.targetVersion != GLSL_VERSION_100_ES)
		{
			print("ERROR: Full GLSL ES 1.00 support requested for other GLSL version!\n");
			return false;
		}

		if (spec.expectResult != EXPECT_PASS			&&
			spec.expectResult != EXPECT_VALIDATION_FAIL	&&
			spec.expectResult != EXPECT_BUILD_SUCCESSFUL)
		{
			print("ERROR: Full GLSL ES 1.00 support doesn't make sense when expecting compile/link failure!\n");
			return false;
		}
	}

	if (!de::inBounds(spec.caseType, (CaseType)0, CASETYPE_LAST))
	{
		print("ERROR: Invalid case type!\n");
		return false;
	}

	if (!de::inBounds(spec.expectResult, (ExpectResult)0, EXPECT_LAST))
	{
		print("ERROR: Invalid expected result!\n");
		return false;
	}

	if (!isValid(spec.values))
		return false;

	if (!spec.values.inputs.empty() && !spec.values.outputs.empty() &&
		spec.values.inputs[0].elements.size() / spec.values.inputs[0].type.getScalarSize() != spec.values.outputs[0].elements.size() / spec.values.outputs[0].type.getScalarSize())
	{
		print("ERROR: Number of input and output elements don't match!\n");
		return false;
	}

	if (isSeparable)
	{
		deUint32	usedStageMask	= 0u;

		if (spec.caseType != CASETYPE_COMPLETE)
		{
			print("ERROR: Separable shaders supported only for complete cases!\n");
			return false;
		}

		for (size_t progNdx = 0; progNdx < spec.programs.size(); ++progNdx)
		{
			for (int shaderStageNdx = 0; shaderStageNdx < SHADERTYPE_LAST; ++shaderStageNdx)
			{
				const deUint32	curStageMask	= (1u << shaderStageNdx);

				if (supportedStageMask & curStageMask)
				{
					const bool		hasShader	= !spec.programs[progNdx].sources.sources[shaderStageNdx].empty();
					const bool		isEnabled	= (spec.programs[progNdx].activeStages & curStageMask) != 0;

					if (hasShader != isEnabled)
					{
						print("ERROR: Inconsistent source/enable for shader stage %s!\n", getShaderTypeName((ShaderType)shaderStageNdx));
						return false;
					}

					if (hasShader && (usedStageMask & curStageMask) != 0)
					{
						print("ERROR: Stage %s enabled on multiple programs!\n", getShaderTypeName((ShaderType)shaderStageNdx));
						return false;
					}

					if (isEnabled)
						usedStageMask |= curStageMask;
				}
				else if (!spec.programs[progNdx].sources.sources[shaderStageNdx].empty())
				{
					print("ERROR: Source specified for unsupported shader stage %s!\n", getShaderTypeName((ShaderType)shaderStageNdx));
					return false;
				}
			}
		}

		if ((usedStageMask & vtxFragMask) != vtxFragMask)
		{
			print("ERROR: Vertex and fragment shaders are mandatory!\n");
			return false;
		}

		if ((usedStageMask & tessCtrlEvalMask) != 0 && (usedStageMask & tessCtrlEvalMask) != tessCtrlEvalMask)
		{
			print("ERROR: Both tessellation control and eval shaders must be either enabled or disabled!\n");
			return false;
		}
	}
	else
	{
		const bool	hasVertex		= !spec.programs[0].sources.sources[SHADERTYPE_VERTEX].empty();
		const bool	hasFragment		= !spec.programs[0].sources.sources[SHADERTYPE_FRAGMENT].empty();

		if (spec.programs.size() != 1)
		{
			print("ERROR: Only cases using separable programs can have multiple programs!\n");
			return false;
		}

		if (spec.caseType == CASETYPE_VERTEX_ONLY && (!hasVertex || hasFragment))
		{
			print("ERROR: Vertex-only case must have only vertex shader!\n");
			return false;
		}

		if (spec.caseType == CASETYPE_FRAGMENT_ONLY && (hasVertex || !hasFragment))
		{
			print("ERROR: Fragment-only case must have only fragment shader!\n");
			return false;
		}

		if (spec.caseType == CASETYPE_COMPLETE && (!hasVertex || !hasFragment))
		{
			print("ERROR: Complete case must have at least vertex and fragment shaders\n");
			return false;
		}
	}

	return true;
}